

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryProgramQueryCase::expectQueryError
          (GeometryProgramQueryCase *this,deUint32 program)

{
  int iVar1;
  qpTestResult qVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  Enum<int,_2UL> EVar6;
  Enum<int,_2UL> local_368;
  MessageBuilder local_358;
  GetNameFunc local_1d8;
  int local_1d0;
  Enum<int,_2UL> local_1c8 [2];
  MessageBuilder local_1a8;
  int local_28;
  undefined1 local_24 [4];
  GLenum errorCode;
  GLint dummy;
  Functions *gl;
  GeometryProgramQueryCase *pGStack_10;
  deUint32 program_local;
  GeometryProgramQueryCase *this_local;
  
  gl._4_4_ = program;
  pGStack_10 = this;
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _errorCode = CONCAT44(extraout_var,iVar1);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1a8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [10])0x2b85bd5);
  EVar6 = glu::getProgramParamStr(this->m_target);
  local_1d8 = EVar6.m_getName;
  local_1d0 = EVar6.m_value;
  local_1c8[0].m_getName = local_1d8;
  local_1c8[0].m_value = local_1d0;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1c8);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [30])", expecting INVALID_OPERATION");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  (**(code **)(_errorCode + 0x9d8))(gl._4_4_,this->m_target,local_24);
  local_28 = (**(code **)(_errorCode + 0x800))();
  if (local_28 != 0x502) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_358,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_358,(char (*) [43])"// ERROR: Expected INVALID_OPERATION, got ");
    EVar6 = glu::getErrorStr(local_28);
    local_368.m_getName = EVar6.m_getName;
    local_368.m_value = EVar6.m_value;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_368);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_358);
    qVar2 = tcu::TestContext::getTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "got unexpected error code");
    }
  }
  return;
}

Assistant:

void GeometryProgramQueryCase::expectQueryError (deUint32 program)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	glw::GLint				dummy;
	glw::GLenum				errorCode;

	m_testCtx.getLog() << tcu::TestLog::Message << "Querying " << glu::getProgramParamStr(m_target) << ", expecting INVALID_OPERATION" << tcu::TestLog::EndMessage;
	gl.getProgramiv(program, m_target, &dummy);

	errorCode = gl.getError();

	if (errorCode != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "// ERROR: Expected INVALID_OPERATION, got " << glu::getErrorStr(errorCode) << tcu::TestLog::EndMessage;

		// don't overwrite error
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected error code");
	}
}